

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

Am_Value_List find_and_set_other_lines_with_same(Am_Object *script_line_part,Am_Object *scroll_menu)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  ostream *poVar3;
  Am_Object *in_RDX;
  Am_List_Item *extraout_RDX;
  Am_Value_List AVar4;
  Am_Object not_part;
  Am_Value_List items;
  Am_Object script_line_group;
  Am_Value target_value;
  Am_Object local_68;
  Am_Value_List local_60;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value local_40;
  
  local_40.type = 0;
  local_40.value.wrapper_value = (Am_Wrapper *)0x0;
  local_68.data = (Am_Object_Data *)0x0;
  local_48.data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_50,&Am_Script_List_Header);
  bVar1 = Am_Object::Is_Instance_Of(scroll_menu,&local_50);
  Am_Object::~Am_Object(&local_50);
  if (bVar1) {
    Am_Object::Get_Object((Am_Object *)&local_60,(Am_Slot_Key)scroll_menu,10);
    Am_Object::operator=(&local_68,(Am_Object *)&local_60);
    Am_Object::~Am_Object((Am_Object *)&local_60);
    pAVar2 = Am_Object::Get(&local_68,0x169,0);
    Am_Value::operator=(&local_40,pAVar2);
  }
  else {
    pAVar2 = Am_Object::Get(scroll_menu,0x169,0);
    Am_Value::operator=(&local_40,pAVar2);
    Am_Object::operator=(&local_68,scroll_menu);
  }
  Am_Value_List::Am_Value_List((Am_Value_List *)script_line_part);
  value = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
  Am_Value_List::Add((Am_Value_List *)script_line_part,value,Am_TAIL,true);
  set_text_leaf_parts(&local_68,&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Get(in_RDX,0xa2,0);
  Am_Value_List::Am_Value_List(&local_60,pAVar2);
  Am_Value_List::Start(&local_60);
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_60);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&local_60);
    Am_Object::operator=(&local_48,pAVar2);
    find_and_set_sub_lines(&local_40,&local_48,&local_68,(Am_Value_List *)script_line_part);
    Am_Value_List::Next(&local_60);
  }
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"final sel_list is ",0x12);
    poVar3 = operator<<((ostream *)&std::cout,(Am_Value_List *)script_line_part);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::ostream::flush();
  }
  Am_Value_List::~Am_Value_List(&local_60);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_68);
  Am_Value::~Am_Value(&local_40);
  AVar4.item = extraout_RDX;
  AVar4.data = (Am_Value_List_Data *)script_line_part;
  return AVar4;
}

Assistant:

Am_Value_List
find_and_set_other_lines_with_same(Am_Object &script_line_part,
                                   Am_Object &scroll_menu)
{
  Am_Value target_value;
  Am_Object not_part, script_line_group;
  if (script_line_part.Is_Instance_Of(Am_Script_List_Header)) {
    not_part = script_line_part.Get_Owner(); //the group
    target_value = not_part.Get(Am_VALUE);
  } else {
    target_value = script_line_part.Get(Am_VALUE);
    not_part = script_line_part;
  }
  Am_Value_List ret_list;
  ret_list.Add(not_part); //the main one should be first
  set_text_leaf_parts(not_part, Am_Motif_Light_Green);
  Am_Value_List items = scroll_menu.Get(Am_ITEMS);
  for (items.Start(); !items.Last(); items.Next()) {
    script_line_group = items.Get();
    find_and_set_sub_lines(target_value, script_line_group, not_part, ret_list);
  }
  if (am_sdebug)
    std::cout << "final sel_list is " << ret_list << std::endl << std::flush;
  return ret_list;
}